

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

bool TryTakeLong(ExprBase *expression,longlong *result)

{
  ExprBoolLiteral *pEVar1;
  ExprCharacterLiteral *pEVar2;
  ExprIntegerLiteral *pEVar3;
  ExprRationalLiteral *pEVar4;
  ExprRationalLiteral *expr_3;
  ExprIntegerLiteral *expr_2;
  ExprCharacterLiteral *expr_1;
  ExprBoolLiteral *expr;
  longlong *result_local;
  ExprBase *expression_local;
  
  pEVar1 = getType<ExprBoolLiteral>(expression);
  if (pEVar1 == (ExprBoolLiteral *)0x0) {
    pEVar2 = getType<ExprCharacterLiteral>(expression);
    if (pEVar2 == (ExprCharacterLiteral *)0x0) {
      pEVar3 = getType<ExprIntegerLiteral>(expression);
      if (pEVar3 == (ExprIntegerLiteral *)0x0) {
        pEVar4 = getType<ExprRationalLiteral>(expression);
        if (pEVar4 == (ExprRationalLiteral *)0x0) {
          expression_local._7_1_ = false;
        }
        else {
          *result = (long)pEVar4->value;
          expression_local._7_1_ = true;
        }
      }
      else {
        *result = pEVar3->value;
        expression_local._7_1_ = true;
      }
    }
    else {
      *result = (long)(char)(pEVar2->super_ExprBase).field_0x29;
      expression_local._7_1_ = true;
    }
  }
  else {
    *result = (long)(int)(uint)(((pEVar1->super_ExprBase).field_0x29 & 1) != 0);
    expression_local._7_1_ = true;
  }
  return expression_local._7_1_;
}

Assistant:

bool TryTakeLong(ExprBase *expression, long long &result)
{
	if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(expression))
	{
		result = expr->value ? 1 : 0;
		return true;
	}

	if(ExprCharacterLiteral *expr = getType<ExprCharacterLiteral>(expression))
	{
		result = expr->value;
		return true;
	}

	if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(expression))
	{
		result = expr->value;
		return true;
	}

	if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(expression))
	{
		result = (long long)expr->value;
		return true;
	}

	return false;
}